

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O2

int __thiscall
AbstractModuleClient::processCommandMsg(AbstractModuleClient *this,string *cmdType,TrodesMsg *msg)

{
  network_pimpl *this_00;
  _Alloc_hider __s1;
  bool bVar1;
  int iVar2;
  string *this_01;
  string op;
  string file;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  bVar1 = std::operator==(cmdType,"_Quit");
  if (bVar1) {
    (*(this->super_MlmWrap)._vptr_MlmWrap[0xd])(this);
    return 0;
  }
  bVar1 = std::operator==(cmdType,"_File");
  if (bVar1) {
    TrodesMsg::popstr_abi_cxx11_(&local_f8,msg);
    __s1._M_p = local_f8._M_dataplus._M_p;
    iVar2 = strcmp(local_f8._M_dataplus._M_p,"_fopen");
    if (iVar2 != 0) {
      iVar2 = strcmp(__s1._M_p,"_fclose");
      if (iVar2 == 0) {
        this_00 = (this->super_MlmWrap).state;
        std::__cxx11::string::string((string *)&local_d8,"",&local_f9);
        network_pimpl::setTrodes_filename(this_00,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        (*(this->super_MlmWrap)._vptr_MlmWrap[10])(this);
      }
      goto LAB_001849f2;
    }
    TrodesMsg::popstr_abi_cxx11_(&local_d8,msg);
    network_pimpl::setTrodes_filename((this->super_MlmWrap).state,&local_d8);
    std::__cxx11::string::string(local_38,(string *)&local_d8);
    (*(this->super_MlmWrap)._vptr_MlmWrap[9])(this,local_38);
    std::__cxx11::string::~string(local_38);
    this_01 = &local_d8;
  }
  else {
    bVar1 = std::operator==(cmdType,"_Source");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_58,"i",(allocator *)&local_f8);
      TrodesMsg::popcontents<int>(msg,&local_58,(int *)&local_d8);
      std::__cxx11::string::~string((string *)&local_58);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      if ((uint)local_d8._M_dataplus._M_p < 7) {
        std::__cxx11::string::assign((char *)&local_f8);
      }
      std::__cxx11::string::string((string *)&local_78,(string *)&local_f8);
      (*(this->super_MlmWrap)._vptr_MlmWrap[0xc])(this,&local_78);
      this_01 = &local_78;
    }
    else {
      bVar1 = std::operator==(cmdType,"_Acq");
      if (!bVar1) {
        return 0;
      }
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&local_98,"s4",&local_f9);
      TrodesMsg::popcontents<std::__cxx11::string,unsigned_int>
                (msg,&local_98,&local_f8,(uint *)&local_d8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::string((string *)&local_b8,(string *)&local_f8);
      (*(this->super_MlmWrap)._vptr_MlmWrap[0xb])
                (this,&local_b8,(ulong)(uint)local_d8._M_dataplus._M_p);
      this_01 = &local_b8;
    }
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_001849f2:
  std::__cxx11::string::~string((string *)&local_f8);
  return 0;
}

Assistant:

int AbstractModuleClient::processCommandMsg(std::string cmdType, TrodesMsg &msg) {
    int rc = 0;
    if (cmdType == quit_CMD) {
        // std::cout << "Client " << id << " got quit command.\n";
        recv_quit();
    }
    else if(cmdType == file_CMD){
        //Call user defined file commands
        std::string op = msg.popstr();
        if(streq(op.c_str(), file_OPEN)){
            std::string file = msg.popstr();
            state->setTrodes_filename(file);
            recv_file_open(file);
        }
        else if(streq(op.c_str(), file_CLOSE)){
            state->setTrodes_filename("");
            recv_file_close();
        }
    }
    else if(cmdType == source_CMD){
        int src;
        msg.popcontents("i", src);
        std::string src_string;
        switch (src) {
        case None:
            src_string = "None";
            break;
        case Fake:
            src_string = "Generator";
            break;
        case FakeSpikes:
            src_string = "Spikes Generator";
            break;
        case File:
            src_string = "File";
            break;
        case Ethernet:
            src_string = "Ethernet";
            break;
        case USBDAQ:
            src_string = "USB";
            break;
        case Rhythm:
            src_string = "Rhythm";
            break;
        default:
            break;
        }
        // std::cerr << "got source " << src_string << "\n";
        recv_source(src_string);
    }
    else if(cmdType == acquisition_CMD){
        std::string type;
        uint32_t timestamp;
        msg.popcontents("s4",type,timestamp);
        recv_acquisition(type, timestamp);
    }
    // else{
    //     std::cout << "[AMC]: Trodes Command [" << cmdType << "] not recognized.\n";
    // }
    return rc;
}